

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,NamespaceAliasDeclaration *o)

{
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&o->targetNamespace);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&o->specialisationArgs);
  return;
}

Assistant:

virtual void visit (AST::NamespaceAliasDeclaration& o)
    {
        visitObjectIfNotNull (o.targetNamespace);
        visitObjectIfNotNull (o.specialisationArgs);
    }